

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

Bounds3f * __thiscall pbrt::Triangle::Bounds(Bounds3f *__return_storage_ptr__,Triangle *this)

{
  undefined8 uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  lVar2 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar5 = (long)this->triIndex;
  lVar6 = *(long *)(lVar2 + 8);
  lVar2 = *(long *)(lVar2 + 0x10);
  lVar7 = (long)*(int *)(lVar6 + lVar5 * 0xc);
  lVar8 = (long)*(int *)(lVar6 + 4 + lVar5 * 0xc);
  lVar6 = (long)*(int *)(lVar6 + 8 + lVar5 * 0xc);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(lVar2 + lVar8 * 0xc);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(lVar2 + lVar6 * 0xc);
  auVar9 = ZEXT416(*(uint *)(lVar2 + 8 + lVar7 * 0xc));
  auVar10 = ZEXT416(*(uint *)(lVar2 + 8 + lVar8 * 0xc));
  auVar3 = vminss_avx(auVar10,auVar9);
  auVar9 = vmaxss_avx(auVar10,auVar9);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(lVar2 + lVar7 * 0xc);
  auVar10 = ZEXT416(*(uint *)(lVar2 + 8 + lVar6 * 0xc));
  auVar4 = vminss_avx(auVar10,auVar3);
  auVar3 = vmaxss_avx(auVar10,auVar9);
  auVar10 = vminps_avx(auVar12,auVar11);
  auVar9 = vmaxps_avx(auVar12,auVar11);
  auVar10 = vminps_avx(auVar13,auVar10);
  auVar9 = vmaxps_avx(auVar13,auVar9);
  uVar1 = vmovlps_avx(auVar10);
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z = auVar4._0_4_;
  uVar1 = vmovlps_avx(auVar9);
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = auVar3._0_4_;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    const TriangleMesh *GetMesh() const {
#ifdef PBRT_IS_GPU_CODE
        return (*allTriangleMeshesGPU)[meshIndex];
#else
        return (*allMeshes)[meshIndex];
#endif
    }